

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestRunStats::~TestRunStats(TestRunStats *this)

{
  TestRunStats *this_local;
  
  this->_vptr_TestRunStats = (_func_int **)&PTR__TestRunStats_0036fce8;
  TestRunInfo::~TestRunInfo(&this->runInfo);
  return;
}

Assistant:

TestRunStats::~TestRunStats() {}